

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_shared_reference.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_55e35::lower_shared_reference_visitor::insert_buffer_access
          (lower_shared_reference_visitor *this,void *mem_ctx,ir_dereference *deref,glsl_type *type,
          ir_rvalue *offset,uint mask,int param_6)

{
  ir_instruction *piVar1;
  int iVar2;
  ir_rvalue *piVar3;
  undefined4 extraout_var;
  ir_dereference *val;
  ir_assignment *piVar4;
  exec_node *local_a0;
  exec_node *local_88;
  exec_node *local_70;
  operand local_60;
  deref local_58;
  ir_rvalue *local_50;
  ir_rvalue *value;
  ir_call *load;
  ir_call *store;
  ir_rvalue *piStack_30;
  uint mask_local;
  ir_rvalue *offset_local;
  glsl_type *type_local;
  ir_dereference *deref_local;
  void *mem_ctx_local;
  lower_shared_reference_visitor *this_local;
  
  store._4_4_ = mask;
  piStack_30 = offset;
  offset_local = (ir_rvalue *)type;
  type_local = (glsl_type *)deref;
  deref_local = (ir_dereference *)mem_ctx;
  mem_ctx_local = this;
  if (*(int *)&(this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
               super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x34 == 1) {
    load = shared_store(this,mem_ctx,&deref->super_ir_rvalue,offset,mask);
    local_70 = (exec_node *)0x0;
    if (load != (ir_call *)0x0) {
      local_70 = &(load->super_ir_instruction).super_exec_node;
    }
    exec_node::insert_after
              (&((this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                 super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir)->
                super_exec_node,local_70);
  }
  else {
    value = (ir_rvalue *)shared_load(this,mem_ctx,type,offset);
    local_88 = (exec_node *)0x0;
    if ((ir_call *)value != (ir_call *)0x0) {
      local_88 = &(((ir_call *)value)->super_ir_instruction).super_exec_node;
    }
    exec_node::insert_before
              (&((this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                 super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir)->
                super_exec_node,local_88);
    piVar3 = ir_instruction::as_rvalue((ir_instruction *)value->type);
    iVar2 = (*(piVar3->super_ir_instruction)._vptr_ir_instruction[4])(piVar3,deref_local,0);
    local_50 = (ir_rvalue *)CONCAT44(extraout_var,iVar2);
    piVar1 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
             super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
    val = (ir_dereference *)(**(code **)(*(long *)type_local + 0x20))(type_local,deref_local,0);
    ir_builder::deref::deref(&local_58,val);
    ir_builder::operand::operand(&local_60,local_50);
    piVar4 = ir_builder::assign(local_58,local_60);
    local_a0 = (exec_node *)0x0;
    if (piVar4 != (ir_assignment *)0x0) {
      local_a0 = &(piVar4->super_ir_instruction).super_exec_node;
    }
    exec_node::insert_before(&piVar1->super_exec_node,local_a0);
  }
  return;
}

Assistant:

void
lower_shared_reference_visitor::insert_buffer_access(void *mem_ctx,
                                                     ir_dereference *deref,
                                                     const glsl_type *type,
                                                     ir_rvalue *offset,
                                                     unsigned mask,
                                                     int /* channel */)
{
   if (buffer_access_type == shared_store_access) {
      ir_call *store = shared_store(mem_ctx, deref, offset, mask);
      base_ir->insert_after(store);
   } else {
      ir_call *load = shared_load(mem_ctx, type, offset);
      base_ir->insert_before(load);
      ir_rvalue *value = load->return_deref->as_rvalue()->clone(mem_ctx, NULL);
      base_ir->insert_before(assign(deref->clone(mem_ctx, NULL),
                                    value));
   }
}